

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::DirectoryInputNodeTask::start
          (DirectoryInputNodeTask *this,TaskInterface ti)

{
  pointer pSVar1;
  BuildKey *this_00;
  char *pcVar2;
  TaskInterface ti_00;
  size_t in_RCX;
  pointer pSVar3;
  StringRef path;
  TaskInterface local_80;
  string local_70 [32];
  string local_50 [32];
  
  local_80.ctx = ti.ctx;
  local_80.impl = ti.impl;
  pSVar1 = (this->node->mustScanAfterPaths).
           super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar3 = (this->node->mustScanAfterPaths).
                super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    this_00 = (BuildKey *)pSVar3->Data;
    pcVar2 = (char *)pSVar3->Length;
    this->totalBlockingDeps = this->totalBlockingDeps + 1;
    path.Length = in_RCX;
    path.Data = pcVar2;
    llbuild::buildsystem::BuildKey::makeNode((BuildKey *)local_70,this_00,path);
    std::__cxx11::string::string(local_50,local_70);
    llbuild::core::TaskInterface::request
              (&local_80,(KeyType *)local_50,(long)this->totalBlockingDeps);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  if (this->totalBlockingDeps == 0) {
    ti_00.ctx = local_80.ctx;
    ti_00.impl = local_80.impl;
    performUnblockedRequest(this,ti_00);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // We reserve inputID=0 for the blocked DirectoryTreeSignature request.
    // inputID=1, 2, ... are used for mustScanAfterPaths
    for (auto mustScanAfterPath: node.getMustScanAfterPaths()) {
      ++totalBlockingDeps;
      ti.request(BuildKey::makeNode(mustScanAfterPath).toData(), totalBlockingDeps);
    }

    // If mustScanAfterPaths is empty, simply request DirectoryTreeSignature in start
    if (totalBlockingDeps == 0) {
      performUnblockedRequest(ti);
    }
  }